

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O0

void * load_image_fn(sexp ctx,sexp dl,sexp name)

{
  long lVar1;
  char *__haystack;
  undefined8 uVar2;
  char *pcVar3;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  bool bVar4;
  char *symbol_name;
  char *handle_name;
  char *new_file_name;
  char *rel_name;
  char *file_name;
  void *fn;
  sexp ls;
  char *in_stack_00000070;
  sexp in_stack_00000078;
  char *local_40;
  void *local_30;
  int *local_28;
  
  lVar1 = *(long *)(in_RDX + 8) + 0x10 + *(long *)(in_RDX + 0x10);
  if (((in_RSI == (int *)0x0) || (((ulong)in_RSI & 3) != 0)) || (*in_RSI != 0x1a)) {
    local_30 = (void *)dlsym(0,lVar1);
  }
  else {
    if (*(long *)(in_RSI + 4) == 0) {
      __haystack = (char *)(*(long *)(*(long *)(in_RSI + 2) + 8) + 0x10 +
                           *(long *)(*(long *)(in_RSI + 2) + 0x10));
      uVar2 = dlopen(__haystack,1);
      *(undefined8 *)(in_RSI + 4) = uVar2;
      if (*(long *)(in_RSI + 4) == 0) {
        local_28 = *(int **)(*(long *)(in_RDI + 0x28) + 0x70);
        while( true ) {
          bVar4 = false;
          if (((ulong)local_28 & 3) == 0) {
            bVar4 = *local_28 == 6;
          }
          if (!bVar4) break;
          pcVar3 = strstr(__haystack,
                          (char *)(*(long *)(*(long *)(local_28 + 2) + 8) + 0x10 +
                                  *(long *)(*(long *)(local_28 + 2) + 0x10)));
          if (pcVar3 == __haystack) {
            for (local_40 = __haystack + *(long *)(*(long *)(local_28 + 2) + 0x18); *local_40 == '/'
                ; local_40 = local_40 + 1) {
            }
            pcVar3 = sexp_find_module_file_raw(in_stack_00000078,in_stack_00000070);
            if (pcVar3 != (char *)0x0) {
              uVar2 = dlopen(pcVar3,1);
              *(undefined8 *)(in_RSI + 4) = uVar2;
              free(pcVar3);
              if (*(long *)(in_RSI + 4) != 0) break;
            }
          }
          local_28 = *(int **)(local_28 + 4);
        }
        if (*(long *)(in_RSI + 4) == 0) {
          snprintf(gc_heap_err_str,0x100,"dlopen failure: %s",
                   *(long *)(*(long *)(in_RSI + 2) + 8) + 0x10 +
                   *(long *)(*(long *)(in_RSI + 2) + 0x10));
          return (void *)0x0;
        }
      }
    }
    local_30 = (void *)dlsym(*(undefined8 *)(in_RSI + 4),lVar1);
  }
  if (local_30 == (void *)0x0) {
    snprintf(gc_heap_err_str,0x100,"dynamic function lookup failure: %s %s","<static>",lVar1);
  }
  return local_30;
}

Assistant:

static void* load_image_fn(sexp ctx, sexp dl, sexp name) {
  sexp ls;
  void *fn = NULL;
  char *file_name, *rel_name=NULL, *new_file_name;
  char *handle_name = "<static>";
  char *symbol_name = sexp_string_data(name);
  if (dl && sexp_dlp(dl)) {
    if (!sexp_dl_handle(dl)) {
      /* try exact file, then the search path */
      file_name = sexp_string_data(sexp_dl_file(dl));
      sexp_dl_handle(dl) = dlopen(file_name, RTLD_LAZY);
      if (!sexp_dl_handle(dl)) {
        for (ls = sexp_global(ctx, SEXP_G_MODULE_PATH); sexp_pairp(ls); ls=sexp_cdr(ls)) {
          if (strstr(file_name, sexp_string_data(sexp_car(ls))) == file_name) {
            rel_name = file_name + sexp_string_size(sexp_car(ls));
            while (*rel_name == '/')
              ++rel_name;
            new_file_name = sexp_find_module_file_raw(ctx, rel_name);
            if (new_file_name) {
              sexp_dl_handle(dl) = dlopen(new_file_name, RTLD_LAZY);
              free(new_file_name);
              if (sexp_dl_handle(dl))
                break;
            }
          }
        }
        if (!sexp_dl_handle(dl)) {
          handle_name = sexp_string_data(sexp_dl_file(dl));
          snprintf(gc_heap_err_str, ERR_STR_SIZE, "dlopen failure: %s",
                   handle_name);
          return NULL;
        }
      }
    }
    fn = dlsym(sexp_dl_handle(dl), symbol_name);
  } else {
    fn = dlsym(SEXP_RTLD_DEFAULT, symbol_name);
  }
  if (!fn) {
    snprintf(gc_heap_err_str, ERR_STR_SIZE,
             "dynamic function lookup failure: %s %s",
             handle_name, symbol_name);
  }
  return fn;
}